

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

void Dtt_PrintMulti2(Dtt_Man_t *p)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = 0;
  do {
    printf("n=%d : ",(ulong)uVar1);
    if (0 < p->nClasses) {
      lVar2 = 0;
      do {
        if (p->pNodes[lVar2] == uVar1) {
          printf("%d ",(ulong)(uint)p->pTimes[lVar2]);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < p->nClasses);
    }
    putchar(10);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 8);
  return;
}

Assistant:

void Dtt_PrintMulti2( Dtt_Man_t * p )
{
    int i, n;
    for ( n = 0; n <= 7; n++ )
    {
        printf( "n=%d : ", n);
        for ( i = 0; i < p->nClasses; i++ )
            if ( p->pNodes[i] == n )
                printf( "%d ", p->pTimes[i] );
        printf( "\n" );
    }
}